

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int32 bio_fread_1d(void **buf,size_t el_sz,uint32 *n_el,FILE *fp,int32 sw,uint32 *ck)

{
  int32 iVar1;
  uint32 uVar2;
  void *buf_00;
  char *fmt;
  long ln;
  
  iVar1 = bio_fread(n_el,4,1,fp,sw,ck);
  if (iVar1 == 1) {
    if ((ulong)*n_el == 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
              ,0x173,"Bad arraysize: %d\n",0);
      goto LAB_0010f3df;
    }
    buf_00 = __ckd_calloc__((ulong)*n_el,el_sz,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                            ,0x176);
    *buf = buf_00;
    uVar2 = bio_fread(buf_00,(int32)el_sz,*n_el,fp,sw,ck);
    if (uVar2 == *n_el) {
      return uVar2;
    }
    fmt = "fread(arraydata) failed\n";
    ln = 0x17a;
  }
  else {
    fmt = "fread(arraysize) failed\n";
    ln = 0x171;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
          ,ln,fmt);
LAB_0010f3df:
  exit(1);
}

Assistant:

int32
bio_fread_1d(void **buf, size_t el_sz, uint32 * n_el, FILE * fp,
             int32 sw, uint32 * ck)
{
    /* Read 1-d array size */
    if (bio_fread(n_el, sizeof(int32), 1, fp, sw, ck) != 1)
        E_FATAL("fread(arraysize) failed\n");
    if (*n_el <= 0)
        E_FATAL("Bad arraysize: %d\n", *n_el);

    /* Allocate memory for array data */
    *buf = (void *) ckd_calloc(*n_el, el_sz);

    /* Read array data */
    if (bio_fread(*buf, el_sz, *n_el, fp, sw, ck) != *n_el)
        E_FATAL("fread(arraydata) failed\n");

    return *n_el;
}